

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_right_delim_join.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalRightDelimJoin::Sink
          (PhysicalRightDelimJoin *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  LocalSinkState *pLVar1;
  PhysicalOperator *pPVar2;
  PhysicalHashAggregate *pPVar3;
  OperatorSinkInput distinct_sink_input;
  OperatorSinkInput join_sink_input;
  type local_60;
  type local_58;
  InterruptState *local_50;
  type local_48;
  type local_40;
  InterruptState *local_38;
  
  pLVar1 = input->local_state;
  local_48 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator*(&((this->super_PhysicalDelimJoin).join)->sink_state);
  local_40 = unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
             operator*((unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>
                        *)(pLVar1 + 1));
  local_38 = input->interrupt_state;
  pPVar2 = (this->super_PhysicalDelimJoin).join;
  (*pPVar2->_vptr_PhysicalOperator[0x1a])(pPVar2,context,chunk,&local_48);
  local_60 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator*(&(((this->super_PhysicalDelimJoin).distinct)->super_PhysicalOperator).
                          sink_state);
  local_58 = unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
             operator*((unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>
                        *)&pLVar1[1].partition_info);
  local_50 = input->interrupt_state;
  pPVar3 = (this->super_PhysicalDelimJoin).distinct;
  (*(pPVar3->super_PhysicalOperator)._vptr_PhysicalOperator[0x1a])(pPVar3,context,chunk,&local_60);
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalRightDelimJoin::Sink(ExecutionContext &context, DataChunk &chunk,
                                            OperatorSinkInput &input) const {
	auto &lstate = input.local_state.Cast<RightDelimJoinLocalState>();

	OperatorSinkInput join_sink_input {*join.sink_state, *lstate.join_state, input.interrupt_state};
	join.Sink(context, chunk, join_sink_input);

	OperatorSinkInput distinct_sink_input {*distinct.sink_state, *lstate.distinct_state, input.interrupt_state};
	distinct.Sink(context, chunk, distinct_sink_input);

	return SinkResultType::NEED_MORE_INPUT;
}